

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O0

GLuint gl4cts::KHRDebug::LabelsTest::createTransformFeedback(Functions *gl,RenderContext *rc)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 dVar2;
  GLuint local_1c;
  RenderContext *pRStack_18;
  GLuint id;
  RenderContext *rc_local;
  Functions *gl_local;
  
  local_1c = 0;
  pRStack_18 = rc;
  rc_local = (RenderContext *)gl;
  ctxType.super_ApiType.m_bits = (ApiType)(*rc->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  if (bVar1) {
    (*(code *)rc_local[0x81]._vptr_RenderContext)(1,&local_1c);
    dVar2 = (*(code *)rc_local[0x100]._vptr_RenderContext)();
    glu::checkError(dVar2,"CreateTransformFeedbacks",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x441);
  }
  else {
    (*(code *)rc_local[0xe0]._vptr_RenderContext)(1,&local_1c);
    (*(code *)rc_local[0x1a]._vptr_RenderContext)(0x8e22,local_1c);
    (*(code *)rc_local[0x1a]._vptr_RenderContext)(0x8e22,0);
    dVar2 = (*(code *)rc_local[0x100]._vptr_RenderContext)();
    glu::checkError(dVar2,"GenTransformFeedbacks / BindTransformFeedback",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x448);
  }
  return local_1c;
}

Assistant:

GLuint LabelsTest::createTransformFeedback(const Functions* gl, const glu::RenderContext* rc)
{
	GLuint id = 0;
	if (glu::contextSupports(rc->getType(), glu::ApiType::core(4, 5)))
	{
		gl->createTransformFeedbacks(1, &id);
		GLU_EXPECT_NO_ERROR(gl->getError(), "CreateTransformFeedbacks");
	}
	else
	{
		gl->genTransformFeedbacks(1, &id);
		gl->bindTransformFeedback(GL_TRANSFORM_FEEDBACK, id);
		gl->bindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
		GLU_EXPECT_NO_ERROR(gl->getError(), "GenTransformFeedbacks / BindTransformFeedback");
	}

	return id;
}